

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O3

size_t read_intsAVX2(uint8_t *in,uint32_t *out,int length)

{
  byte bVar1;
  ushort uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  uint32_t *out_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (length < 0x10) {
    sVar11 = 0;
    uVar7 = 0;
  }
  else {
    auVar13._8_8_ = 0x3f803f803f803f80;
    auVar13._0_8_ = 0x3f803f803f803f80;
    auVar14._8_8_ = 0x7f007f007f007f;
    auVar14._0_8_ = 0x7f007f007f007f;
    auVar15._8_8_ = 0x3fff00003fff;
    auVar15._0_8_ = 0x3fff00003fff;
    auVar16._8_8_ = 0x3f8000003f80;
    auVar16._0_8_ = 0x3f8000003f80;
    auVar17._8_8_ = 0x7f0000007f;
    auVar17._0_8_ = 0x7f0000007f;
    auVar18._8_8_ = 0x1fc000001fc000;
    auVar18._0_8_ = 0x1fc000001fc000;
    auVar19[8] = 0x7f;
    auVar19._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar19[9] = 0x7f;
    auVar19[10] = 0x7f;
    auVar19[0xb] = 0x7f;
    auVar19[0xc] = 0x7f;
    auVar19[0xd] = 0x7f;
    auVar19[0xe] = 0x7f;
    auVar19[0xf] = 0x7f;
    auVar20._8_8_ = 0x4000500060007;
    auVar20._0_8_ = 0x4000500060007;
    uVar8 = 0;
    sVar11 = 0;
    do {
      auVar21 = vlddqu_avx(*(undefined1 (*) [16])(in + sVar11));
      uVar2 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar21[0xf] >> 7) << 0xf;
      if (uVar2 == 0) {
        auVar3 = vpmovsxbd_avx2(auVar21);
        auVar21 = vpshufd_avx(auVar21,0xee);
        bVar6 = 0x10;
        iVar9 = 0x10;
        auVar4 = vpmovsxbd_avx2(auVar21);
        *(undefined1 (*) [32])(out + uVar8) = auVar3;
        *(undefined1 (*) [32])(out + uVar8 + 8) = auVar4;
      }
      else {
        uVar7 = uVar2 & 0xfff;
        bVar1 = combined_lookup[uVar7].index;
        bVar6 = combined_lookup[uVar7].bytes_consumed;
        auVar12 = *(undefined1 (*) [16])("" + (ulong)bVar1 * 0x10);
        if (bVar1 < 0x40) {
          auVar12 = vpshufb_avx(auVar21,auVar12);
          iVar9 = 6;
          auVar21 = vpsrlw_avx(auVar12,1);
          auVar21 = vpand_avx(auVar21,auVar13);
          auVar12 = vpternlogq_avx512vl(auVar21,auVar12,auVar14,0xf8);
          auVar21 = vpand_avx(auVar12,auVar15);
          auVar12 = vpsrld_avx(auVar12,0x10);
          *(undefined1 (*) [16])(out + uVar8) = auVar21;
          *(long *)(out + uVar8 + 4) = auVar12._0_8_;
        }
        else if (bVar1 < 0x91) {
          auVar12 = vpshufb_avx(auVar21,auVar12);
          iVar9 = 4;
          auVar21 = vpsrld_avx(auVar12,1);
          auVar22 = vpsrld_avx(auVar12,2);
          auVar21 = vpand_avx(auVar21,auVar16);
          auVar21 = vpternlogq_avx512vl(auVar21,auVar12,auVar17,0xf8);
          auVar21 = vpternlogq_avx512vl(auVar21,auVar22,auVar18,0xf8);
          *(undefined1 (*) [16])(out + uVar8) = auVar21;
        }
        else {
          auVar21 = vpand_avx(auVar21,auVar19);
          iVar9 = 2;
          auVar21 = vpshufb_avx(auVar21,auVar12);
          auVar12 = vpsllvw_avx512vl(auVar21,auVar20);
          auVar21 = vpshldq_avx512_vbmi2(auVar12,auVar21,8);
          auVar21 = vpor_avx(auVar21,auVar12);
          auVar21 = vpmovwb_avx512vl(auVar21);
          *(long *)(out + uVar8) = auVar21._0_8_;
        }
      }
      sVar11 = sVar11 + bVar6;
      iVar5 = (int)uVar8;
      uVar7 = iVar9 + iVar5;
      uVar8 = (ulong)uVar7;
    } while (iVar9 + 0xf + iVar5 < length);
  }
  if ((int)uVar7 < length) {
    out_00 = out + uVar7;
    lVar10 = (ulong)(uint)length - (ulong)uVar7;
    do {
      uVar7 = read_int(in + sVar11,out_00);
      sVar11 = sVar11 + uVar7;
      out_00 = out_00 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  return sVar11;
}

Assistant:

size_t read_intsAVX2(const uint8_t *in, uint32_t *out, int length) {
  size_t consumed = 0;
  int count;
  for (count = 0; count + 15 < length;) {
    int ints_read;
    consumed += read_int_groupAVX2(in + consumed, out + count, &ints_read);
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}